

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::setBuffer
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,BufKind kind,void *p,
          size_t size)

{
  BufHdr *pBVar1;
  BufHdr *p_1;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_28;
  
  *(undefined4 *)((long)p + 0x10) = 0;
  *(undefined4 *)((long)p + 0x14) = 1;
  *(undefined ***)p = &PTR__RefCount_00198a88;
  *(size_t *)((long)p + 0x18) = size - 0x28;
  *(ulong *)((long)p + 0x20) = (ulong)(kind != BufKind_Shared) << 2;
  *(undefined8 *)((long)p + 8) = 0;
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_28,(BufHdr *)p);
  pBVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    rc::RefCount::release(&pBVar1->super_RefCount);
  }
  pBVar1 = local_28.m_p;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(local_28.m_p + 1)
  ;
  *(undefined1 *)&local_28.m_p[1].super_RefCount._vptr_RefCount = 0;
  local_28.m_p = (BufHdr *)0x0;
  local_28.m_refCount = (RefCount *)0x0;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr = pBVar1;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
  (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated = true;
  rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_28);
  return size - 0x29;
}

Assistant:

size_t
	setBuffer(
		rc::BufKind kind,
		void* p,
		size_t size
	) {
		ASSERT(size >= sizeof(rc::BufHdr) + sizeof(C));

		size_t bufferSize = size - sizeof(rc::BufHdr);
		uint_t flags = kind != rc::BufKind_Static ? rc::BufHdrFlag_Exclusive : 0;

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_INPLACE(rc::BufHdr, (bufferSize, flags), p, NULL);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = (C*)(hdr + 1);
		this->m_p[0] = 0;
		this->m_hdr = hdr.detach();
		this->m_length = 0;
		this->m_isNullTerminated = true;
		return bufferSize / sizeof(C) - 1;
	}